

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O1

void __thiscall
AbstractTransaction_AddTxIn_RemoveTxIn_Test::~AbstractTransaction_AddTxIn_RemoveTxIn_Test
          (AbstractTransaction_AddTxIn_RemoveTxIn_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AbstractTransaction, AddTxIn_RemoveTxIn) {
  uint32_t txin_count = 2;
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  // script is not empty
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
          vout, seq,
          Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac")));

  // script is empty
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "0d0afd7c8e65545f877fa58905d3b50aa114ed885becd6c12232b1d494a7d597"),
          vout, seq, Script()));

  std::vector<TxInReference> list = tx.GetTxInList();
  EXPECT_STREQ(
      list[0].GetTxid().GetHex().c_str(),
      "e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6");
  EXPECT_STREQ(list[0].GetUnlockingScript().GetHex().c_str(),
               "76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac");
  EXPECT_EQ(list[0].GetVout(), vout);
  EXPECT_EQ(list[0].GetSequence(), seq);
  EXPECT_EQ(tx.GetTxInCount(), txin_count);

  // index error
  EXPECT_THROW(tx.RemoveTxIn(3), CfdException);
  // remove success
  EXPECT_NO_THROW(tx.RemoveTxIn(0));
  txin_count--;
  EXPECT_EQ(tx.GetTxInCount(), txin_count);
}